

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

int nn_pipe_send(nn_pipe *self,nn_msg *msg)

{
  int extraout_EAX;
  uint uVar1;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint extraout_EAX_03;
  void *in_RCX;
  int option;
  nn_pipebase *unaff_RBX;
  int level;
  nn_pipebase *pnVar2;
  nn_pipebase *self_00;
  size_t *in_R8;
  
  level = (int)msg;
  if (self[0x62] == (nn_pipe)0x1) {
    self[0x62] = (nn_pipe)0x2;
    pnVar2 = (nn_pipebase *)self;
    uVar1 = (*(code *)**(undefined8 **)(self + 0x58))();
    unaff_RBX = (nn_pipebase *)self;
    if ((int)uVar1 < 0) goto LAB_0011fb2d;
    in_RCX = (void *)(ulong)(byte)self[0x62];
    if (self[0x62] == (nn_pipe)0x3) {
      self[0x62] = (nn_pipe)0x1;
      return uVar1;
    }
  }
  else {
    nn_pipe_send_cold_1();
    uVar1 = extraout_EAX_00;
LAB_0011fb2d:
    pnVar2 = (nn_pipebase *)(ulong)uVar1;
    nn_pipe_send_cold_3();
    uVar1 = extraout_EAX_01;
  }
  if ((int)in_RCX == 2) {
    unaff_RBX->outstate = '\x04';
    return uVar1 | 1;
  }
  nn_pipe_send_cold_2();
  if (pnVar2->instate == '\x01') {
    pnVar2->instate = '\x02';
    self_00 = pnVar2;
    uVar1 = (*pnVar2->vfptr->recv)();
    unaff_RBX = pnVar2;
    if (-1 < (int)uVar1) {
      in_RCX = (void *)(ulong)pnVar2->instate;
      if (pnVar2->instate == 3) {
        pnVar2->instate = '\x01';
        return uVar1;
      }
      goto LAB_0011fb7b;
    }
  }
  else {
    nn_pipe_recv_cold_1();
    uVar1 = extraout_EAX_02;
  }
  self_00 = (nn_pipebase *)(ulong)uVar1;
  nn_pipe_recv_cold_3();
  uVar1 = extraout_EAX_03;
LAB_0011fb7b:
  if ((int)in_RCX == 2) {
    unaff_RBX->instate = '\x04';
    return uVar1 | 1;
  }
  nn_pipe_recv_cold_2();
  nn_pipebase_getopt(self_00,level,option,in_RCX,in_R8);
  return extraout_EAX;
}

Assistant:

int nn_pipe_send (struct nn_pipe *self, struct nn_msg *msg)
{
    int rc;
    struct nn_pipebase *pipebase;

    pipebase = (struct nn_pipebase*) self;
    nn_assert (pipebase->outstate == NN_PIPEBASE_OUTSTATE_IDLE);
    pipebase->outstate = NN_PIPEBASE_OUTSTATE_SENDING;
    rc = pipebase->vfptr->send (pipebase, msg);
    errnum_assert (rc >= 0, -rc);
    if (nn_fast (pipebase->outstate == NN_PIPEBASE_OUTSTATE_SENT)) {
        pipebase->outstate = NN_PIPEBASE_OUTSTATE_IDLE;
        return rc;
    }
    nn_assert (pipebase->outstate == NN_PIPEBASE_OUTSTATE_SENDING);
    pipebase->outstate = NN_PIPEBASE_OUTSTATE_ASYNC;
    return rc | NN_PIPEBASE_RELEASE;
}